

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> * __thiscall
testing::internal::
FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::
FindMatchingExpectationLocked
          (FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
           *this,ArgumentTuple *args)

{
  bool bVar1;
  pointer this_00;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>_>
  *in_RDI;
  MutexBase *unaff_retaddr;
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *exp;
  const_reverse_iterator it;
  ExpectationBase *in_stack_ffffffffffffffd0;
  vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  *in_stack_ffffffffffffffd8;
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
  *in_stack_ffffffffffffffe0;
  
  MutexBase::AssertHeld(unaff_retaddr);
  std::
  vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
  ::rbegin(in_stack_ffffffffffffffd8);
  while( true ) {
    std::
    vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
    ::rend(in_stack_ffffffffffffffd8);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>_>
                             *)in_stack_ffffffffffffffd0,in_RDI);
    if (!bVar1) {
      return (TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *
             )0x0;
    }
    this_00 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>_>
              ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>_>
                            *)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = linked_ptr<testing::internal::ExpectationBase>::get(this_00);
    bVar1 = TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::
            ShouldHandleArguments
                      (in_stack_ffffffffffffffe0,(ArgumentTuple *)in_stack_ffffffffffffffd8);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>_>
                  *)in_stack_ffffffffffffffd0);
  }
  return (TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *)
         in_stack_ffffffffffffffd0;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    for (typename UntypedExpectations::const_reverse_iterator it =
             untyped_expectations_.rbegin();
         it != untyped_expectations_.rend(); ++it) {
      TypedExpectation<F>* const exp =
          static_cast<TypedExpectation<F>*>(it->get());
      if (exp->ShouldHandleArguments(args)) {
        return exp;
      }
    }
    return NULL;
  }